

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_wstring_with_string(void)

{
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_38b [2];
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"bravo");
  local_a[0] = trial::dynamic::operator<(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb0,"void relational_suite::compare_wstring_with_string()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,"bravo");
  local_87[0] = trial::dynamic::operator<=(&local_b8,&local_e8);
  local_e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb1,"void relational_suite::compare_wstring_with_string()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"bravo");
  local_eb[0] = trial::dynamic::operator>(&local_128,&local_158);
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb2,"void relational_suite::compare_wstring_with_string()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,"bravo");
  local_15b[0] = trial::dynamic::operator>=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb3,"void relational_suite::compare_wstring_with_string()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_238,"zulu");
  local_1cb[0] = trial::dynamic::operator<(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb5,"void relational_suite::compare_wstring_with_string()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8,"zulu");
  local_23b[0] = trial::dynamic::operator<=(&local_278,&local_2a8);
  local_2a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb6,"void relational_suite::compare_wstring_with_string()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"zulu");
  local_2ab[0] = trial::dynamic::operator>(&local_2e8,&local_318);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb7,"void relational_suite::compare_wstring_with_string()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388,"zulu");
  local_31b[0] = trial::dynamic::operator>=(&local_358,&local_388);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cb8,"void relational_suite::compare_wstring_with_string()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3f8,"bravo");
  local_38b[0] = trial::dynamic::operator<(&local_3c8,&local_3f8);
  local_3f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") < variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cba,"void relational_suite::compare_wstring_with_string()",local_38b,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_468,"bravo");
  local_3fb[0] = trial::dynamic::operator<=(&local_438,&local_468);
  local_469 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") <= variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cbb,"void relational_suite::compare_wstring_with_string()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4a8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,"bravo");
  local_46b[0] = trial::dynamic::operator>(&local_4a8,&local_4d8);
  local_4d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") > variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cbc,"void relational_suite::compare_wstring_with_string()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_548,"bravo");
  local_4db[0] = trial::dynamic::operator>=(&local_518,&local_548);
  local_549 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") >= variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1cbd,"void relational_suite::compare_wstring_with_string()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  return;
}

Assistant:

void compare_wstring_with_string()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable("bravo"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable("bravo"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable("bravo"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable("bravo"), true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable("zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable("zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable("zulu"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable("zulu"), true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") < variable("bravo"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") <= variable("bravo"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") > variable("bravo"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") >= variable("bravo"), true);
}